

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::setSubroutineUniform
          (ExplicitUniformLocationCaseBase *this,SubroutineUniform *subroutineUniform,
          CompiledProgram *program,GLenum stage,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indicesOut)

{
  GLuint GVar1;
  CompiledProgram *pCVar2;
  GLenum GVar3;
  bool bVar4;
  string *psVar5;
  SubroutineFunction *this_00;
  GLchar *pGVar6;
  size_type sVar7;
  reference pvVar8;
  byte local_22a;
  allocator<unsigned_int> local_229;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  GLuint local_20c;
  SubroutineFunction *pSStack_208;
  int index;
  SubroutineFunction *selectedFunction;
  undefined1 local_1d0 [8];
  ostringstream name;
  int local_3c;
  int local_38;
  GLint loc;
  int arrayElem;
  bool used;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indicesOut_local;
  CompiledProgram *pCStack_20;
  GLenum stage_local;
  CompiledProgram *program_local;
  SubroutineUniform *subroutineUniform_local;
  ExplicitUniformLocationCaseBase *this_local;
  
  indicesOut_local._4_4_ = stage;
  pCStack_20 = program;
  program_local = (CompiledProgram *)subroutineUniform;
  subroutineUniform_local = (SubroutineUniform *)this;
  bVar4 = DefOccurence::occurs(&subroutineUniform->defOccurence,stage);
  local_22a = 0;
  if (bVar4) {
    local_22a = *(byte *)((long)&program_local[2].stages.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 4);
  }
  if ((local_22a & 1) != 0) {
    for (local_38 = 0; local_38 < *(int *)&program_local[2].field_0x4; local_38 = local_38 + 1) {
      pCVar2 = program_local + 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&name.field_0x170,
                 &pCStack_20->stages);
      bVar4 = LayoutSpecifierBase::isImplicit
                        ((LayoutSpecifierBase *)
                         &(pCVar2->stages).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&name.field_0x170);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&name.field_0x170);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        psVar5 = glcts::(anonymous_namespace)::SubroutineUniform::getName_abi_cxx11_
                           ((SubroutineUniform *)program_local);
        std::operator<<((ostream *)local_1d0,(string *)psVar5);
        SubroutineUniform::streamArrayStr
                  ((SubroutineUniform *)program_local,(ostringstream *)local_1d0,local_38);
        GVar3 = indicesOut_local._4_4_;
        GVar1 = pCStack_20->name;
        std::__cxx11::ostringstream::str();
        pGVar6 = (GLchar *)std::__cxx11::string::c_str();
        local_3c = glu::CallLogWrapper::glGetSubroutineUniformLocation
                             (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,
                              GVar3,pGVar6);
        std::__cxx11::string::~string((string *)&selectedFunction);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
      }
      else {
        local_3c = *(int *)&program_local[1].stages.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + local_38;
      }
      if (local_3c < 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x617,
                      "void glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::setSubroutineUniform(const SubroutineUniform &, const CompiledProgram &, GLenum, std::vector<glw::GLuint> &)"
                     );
      }
      this_00 = SubroutineUniform::getSelectedFunction((SubroutineUniform *)program_local,local_38);
      local_20c = 0xffffffff;
      pSStack_208 = this_00;
      std::allocator<unsigned_int>::allocator(&local_229);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_228,1,(value_type_conflict4 *)((long)&indicesOut_local + 4),&local_229);
      bVar4 = LayoutSpecifierBase::isImplicit((LayoutSpecifierBase *)this_00,&local_228);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_228);
      std::allocator<unsigned_int>::~allocator(&local_229);
      GVar3 = indicesOut_local._4_4_;
      if (bVar4) {
        GVar1 = pCStack_20->name;
        glcts::(anonymous_namespace)::SubroutineFunction::getName_abi_cxx11_
                  ((SubroutineFunction *)pSStack_208);
        pGVar6 = (GLchar *)std::__cxx11::string::c_str();
        local_20c = glu::CallLogWrapper::glGetSubroutineIndex
                              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1
                               ,GVar3,pGVar6);
      }
      else {
        local_20c = (pSStack_208->index).super_LayoutSpecifierBase.val;
      }
      sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(indicesOut);
      GVar1 = local_20c;
      if ((int)sVar7 <= local_3c) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x612,
                      "void glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::setSubroutineUniform(const SubroutineUniform &, const CompiledProgram &, GLenum, std::vector<glw::GLuint> &)"
                     );
      }
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (indicesOut,(long)local_3c);
      *pvVar8 = GVar1;
    }
  }
  return;
}

Assistant:

void setSubroutineUniform(const SubroutineUniform& subroutineUniform, const CompiledProgram& program, GLenum stage,
							  std::vector<glw::GLuint>& indicesOut)
	{
		bool used = subroutineUniform.defOccurence.occurs(stage) && subroutineUniform.used;
		if (used)
		{

			for (int arrayElem = 0; arrayElem < subroutineUniform.arraySize; arrayElem++)
			{
				GLint loc = -1;
				if (subroutineUniform.location.isImplicit(program.stages))
				{
					std::ostringstream name;
					name << subroutineUniform.getName();
					subroutineUniform.streamArrayStr(name, arrayElem);
					loc = glGetSubroutineUniformLocation(program.name, stage, name.str().c_str());
				}
				else
				{
					loc = subroutineUniform.location.val + arrayElem;
				}

				if (loc >= 0)
				{
					const SubroutineFunction& selectedFunction = subroutineUniform.getSelectedFunction(arrayElem);

					int index = -1;
					if (selectedFunction.index.isImplicit(std::vector<GLenum>(1, stage)))
					{
						index = glGetSubroutineIndex(program.name, stage, selectedFunction.getName().c_str());
					}
					else
					{
						index = selectedFunction.index.val;
					}

					if (loc < (int)indicesOut.size())
					{
						indicesOut[loc] = index;
					}
					else
					{
						assert(0);
					}
				}
				else
				{
					assert(0);
				}
			}
		}
	}